

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

void __thiscall
QtMWidgets::NavigationBarPrivate::removeWidget(NavigationBarPrivate *this,QWidget *w)

{
  bool bVar1;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar2;
  NavigationItem *pNVar3;
  const_iterator o;
  NavigationItem *pNVar4;
  qsizetype i;
  QSharedPointer<QtMWidgets::NavigationItem> *c;
  const_iterator __end1;
  const_iterator __begin1;
  QVector<QSharedPointer<NavigationItem>_> *__range1;
  QVector<QSharedPointer<NavigationItem>_> tmp;
  undefined1 local_28 [8];
  QSharedPointer<QtMWidgets::NavigationItem> item;
  QWidget *w_local;
  NavigationBarPrivate *this_local;
  
  item.d = (Data *)w;
  pQVar2 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&this->itemsMap,(QWidget **)&item.d);
  QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28,pQVar2);
  QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::remove
            (&this->itemsMap,(char *)&item.d);
  QStackedWidget::removeWidget((QWidget *)this->stack);
  pNVar3 = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                     ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
  QList<QSharedPointer<QtMWidgets::NavigationItem>_>::QList
            ((QList<QSharedPointer<QtMWidgets::NavigationItem>_> *)&__range1,&pNVar3->children);
  __end1 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::begin
                     ((QList<QSharedPointer<QtMWidgets::NavigationItem>_> *)&__range1);
  o = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::end
                ((QList<QSharedPointer<QtMWidgets::NavigationItem>_> *)&__range1);
  while( true ) {
    bVar1 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::const_iterator::operator!=
                      (&__end1,o);
    if (!bVar1) break;
    pQVar2 = QList<QSharedPointer<QtMWidgets::NavigationItem>_>::const_iterator::operator*(&__end1);
    pNVar3 = QSharedPointer<QtMWidgets::NavigationItem>::operator->(pQVar2);
    removeWidget(this,pNVar3->self);
    QList<QSharedPointer<QtMWidgets::NavigationItem>_>::const_iterator::operator++(&__end1);
  }
  pNVar3 = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                     ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
  if (pNVar3->parent != (NavigationItem *)0x0) {
    pNVar3 = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                       ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
    pNVar3 = pNVar3->parent;
    pNVar4 = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                       ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
    i = QListSpecialMethodsBase<QSharedPointer<QtMWidgets::NavigationItem>>::
        indexOf<QSharedPointer<QtMWidgets::NavigationItem>>
                  ((QListSpecialMethodsBase<QSharedPointer<QtMWidgets::NavigationItem>> *)
                   &pNVar4->parent->children,(QSharedPointer<QtMWidgets::NavigationItem> *)local_28,
                   0);
    QList<QSharedPointer<QtMWidgets::NavigationItem>_>::removeAt(&pNVar3->children,i);
  }
  QList<QSharedPointer<QtMWidgets::NavigationItem>_>::~QList
            ((QList<QSharedPointer<QtMWidgets::NavigationItem>_> *)&__range1);
  QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
  return;
}

Assistant:

void
NavigationBarPrivate::removeWidget( QWidget * w )
{
	QSharedPointer< NavigationItem > item = itemsMap[ w ];

	itemsMap.remove( w );
	stack->removeWidget( w );

	const auto tmp = item->children;

	for( const auto & c : tmp )
		removeWidget( c->self );

	if( item->parent )
		item->parent->children.removeAt(
			item->parent->children.indexOf( item ) );
}